

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

ArrayWithPreallocation<unsigned_long,_4UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_long,_4UL>::operator=
          (ArrayWithPreallocation<unsigned_long,_4UL> *this,
          ArrayWithPreallocation<unsigned_long,_4UL> *other)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = other->numActive;
  if (this->numActive < uVar3) {
    reserve(this,uVar3);
    uVar3 = this->numActive;
    if (uVar3 != 0) {
      puVar1 = other->items;
      puVar2 = this->items;
      uVar4 = 0;
      do {
        puVar2[uVar4] = puVar1[uVar4];
        uVar4 = uVar4 + 1;
        uVar3 = this->numActive;
      } while (uVar4 < uVar3);
    }
    uVar4 = other->numActive;
    if (uVar3 < uVar4) {
      puVar1 = this->items;
      puVar2 = other->items;
      do {
        puVar1[uVar3] = puVar2[uVar3];
        uVar3 = uVar3 + 1;
        uVar4 = other->numActive;
      } while (uVar3 < uVar4);
    }
    this->numActive = uVar4;
  }
  else {
    shrink(this,uVar3);
    if (this->numActive != 0) {
      puVar1 = other->items;
      puVar2 = this->items;
      uVar3 = 0;
      do {
        puVar2[uVar3] = puVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->numActive);
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }